

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

XXH_errorcode XXH32_update(void *state_in,void *input,int len)

{
  uint uVar1;
  int *piVar2;
  int in_EDX;
  int *in_RSI;
  long *in_RDI;
  XXH_endianess endian_detected;
  U32 v4_1;
  U32 v3_1;
  U32 v2_1;
  U32 v1_1;
  BYTE *limit_1;
  U32 *p32_1;
  BYTE *bEnd_1;
  BYTE *p_1;
  XXH_state32_t *state_1;
  U32 v4;
  U32 v3;
  U32 v2;
  U32 v1;
  BYTE *limit;
  U32 *p32;
  BYTE *bEnd;
  BYTE *p;
  XXH_state32_t *state;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  int *local_2c8;
  
  piVar2 = (int *)((long)in_RSI + (long)in_EDX);
  *in_RDI = (long)in_EDX + *in_RDI;
  if (*(int *)((long)in_RDI + 0x1c) + in_EDX < 0x10) {
    memcpy((void *)((long)in_RDI + (long)*(int *)((long)in_RDI + 0x1c) + 0x20),in_RSI,(long)in_EDX);
    *(int *)((long)in_RDI + 0x1c) = in_EDX + *(int *)((long)in_RDI + 0x1c);
  }
  else {
    local_2c8 = in_RSI;
    if (*(int *)((long)in_RDI + 0x1c) != 0) {
      memcpy((void *)((long)in_RDI + (long)*(int *)((long)in_RDI + 0x1c) + 0x20),in_RSI,
             (long)(0x10 - *(int *)((long)in_RDI + 0x1c)));
      *(int *)((long)in_RDI + 0xc) = (int)in_RDI[4] * -0x7a143589 + *(int *)((long)in_RDI + 0xc);
      *(uint *)((long)in_RDI + 0xc) =
           *(int *)((long)in_RDI + 0xc) << 0xd | *(uint *)((long)in_RDI + 0xc) >> 0x13;
      *(int *)((long)in_RDI + 0xc) = *(int *)((long)in_RDI + 0xc) * -0x61c8864f;
      *(int *)(in_RDI + 2) = *(int *)((long)in_RDI + 0x24) * -0x7a143589 + (int)in_RDI[2];
      *(uint *)(in_RDI + 2) = (int)in_RDI[2] << 0xd | *(uint *)(in_RDI + 2) >> 0x13;
      *(int *)(in_RDI + 2) = (int)in_RDI[2] * -0x61c8864f;
      *(int *)((long)in_RDI + 0x14) = (int)in_RDI[5] * -0x7a143589 + *(int *)((long)in_RDI + 0x14);
      *(uint *)((long)in_RDI + 0x14) =
           *(int *)((long)in_RDI + 0x14) << 0xd | *(uint *)((long)in_RDI + 0x14) >> 0x13;
      *(int *)((long)in_RDI + 0x14) = *(int *)((long)in_RDI + 0x14) * -0x61c8864f;
      *(int *)(in_RDI + 3) = *(int *)((long)in_RDI + 0x2c) * -0x7a143589 + (int)in_RDI[3];
      *(uint *)(in_RDI + 3) = (int)in_RDI[3] << 0xd | *(uint *)(in_RDI + 3) >> 0x13;
      *(int *)(in_RDI + 3) = (int)in_RDI[3] * -0x61c8864f;
      local_2c8 = (int *)((long)in_RSI + (long)(0x10 - *(int *)((long)in_RDI + 0x1c)));
      *(undefined4 *)((long)in_RDI + 0x1c) = 0;
    }
    if (local_2c8 <= piVar2 + -4) {
      local_2e4 = *(int *)((long)in_RDI + 0xc);
      local_2e8 = (int)in_RDI[2];
      local_2ec = *(int *)((long)in_RDI + 0x14);
      local_2f0 = (int)in_RDI[3];
      do {
        uVar1 = *local_2c8 * -0x7a143589 + local_2e4;
        local_2e4 = (uVar1 * 0x2000 | uVar1 >> 0x13) * -0x61c8864f;
        uVar1 = local_2c8[1] * -0x7a143589 + local_2e8;
        local_2e8 = (uVar1 * 0x2000 | uVar1 >> 0x13) * -0x61c8864f;
        uVar1 = local_2c8[2] * -0x7a143589 + local_2ec;
        local_2ec = (uVar1 * 0x2000 | uVar1 >> 0x13) * -0x61c8864f;
        uVar1 = local_2c8[3] * -0x7a143589 + local_2f0;
        local_2f0 = (uVar1 * 0x2000 | uVar1 >> 0x13) * -0x61c8864f;
        local_2c8 = local_2c8 + 4;
      } while (local_2c8 <= piVar2 + -4);
      *(int *)((long)in_RDI + 0xc) = local_2e4;
      *(int *)(in_RDI + 2) = local_2e8;
      *(int *)((long)in_RDI + 0x14) = local_2ec;
      *(int *)(in_RDI + 3) = local_2f0;
    }
    if (local_2c8 < piVar2) {
      memcpy(in_RDI + 4,local_2c8,(long)piVar2 - (long)local_2c8);
      *(int *)((long)in_RDI + 0x1c) = (int)piVar2 - (int)local_2c8;
    }
  }
  return XXH_OK;
}

Assistant:

XXH_errorcode XXH32_update (void* state_in, const void* input, int len)
{
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;
    
    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH32_update_endian(state_in, input, len, XXH_littleEndian);
    else
        return XXH32_update_endian(state_in, input, len, XXH_bigEndian);
}